

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O3

void duckdb::BinarySerializer::Serialize<duckdb::SelectStatement>
               (SelectStatement *value,WriteStream *stream,SerializationOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BinarySerializer serializer;
  SerializationOptions local_578;
  BinarySerializer local_540;
  
  local_578.serialize_enum_as_string = options->serialize_enum_as_string;
  local_578.serialize_default_values = options->serialize_default_values;
  paVar2 = &local_578.serialization_compatibility.duckdb_version.field_2;
  local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p =
       (options->serialization_compatibility).duckdb_version._M_dataplus._M_p;
  paVar1 = &(options->serialization_compatibility).duckdb_version.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p == paVar1) {
    local_578.serialization_compatibility.duckdb_version.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_578.serialization_compatibility.duckdb_version.field_2._8_8_ =
         *(undefined8 *)((long)&(options->serialization_compatibility).duckdb_version.field_2 + 8);
    local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_578.serialization_compatibility.duckdb_version.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_578.serialization_compatibility.duckdb_version._M_string_length =
       (options->serialization_compatibility).duckdb_version._M_string_length;
  (options->serialization_compatibility).duckdb_version._M_dataplus._M_p = (pointer)paVar1;
  (options->serialization_compatibility).duckdb_version._M_string_length = 0;
  (options->serialization_compatibility).duckdb_version.field_2._M_local_buf[0] = '\0';
  local_578.serialization_compatibility.manually_set =
       (options->serialization_compatibility).manually_set;
  local_578.serialization_compatibility.serialization_version =
       (options->serialization_compatibility).serialization_version;
  BinarySerializer(&local_540,stream,&local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p != paVar2) {
    operator_delete(local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p);
  }
  OnObjectBegin(&local_540);
  SelectStatement::Serialize(value,&local_540.super_Serializer);
  OnObjectEnd(&local_540);
  local_540.super_Serializer._vptr_Serializer = (_func_int **)&PTR__BinarySerializer_0196c678;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_540.data.customs._M_h);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
                  *)&local_540.data.compression_infos);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                  *)&local_540.data.types);
  ::std::
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
                  *)&local_540.data.parameter_data);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_540.data.enums);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                  *)&local_540.data.catalogs);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
                  *)&local_540.data.databases);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                  *)&local_540.data);
  ::std::
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ::~vector(&local_540.debug_stack.
             super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
           );
  Serializer::~Serializer(&local_540.super_Serializer);
  return;
}

Assistant:

static void Serialize(const T &value, WriteStream &stream, SerializationOptions options = SerializationOptions()) {
		BinarySerializer serializer(stream, std::move(options));
		serializer.OnObjectBegin();
		value.Serialize(serializer);
		serializer.OnObjectEnd();
	}